

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O0

bool dxil_spv::wmma_store_is_masked(Impl *impl,StoreInst *inst)

{
  bool bVar1;
  pointer ppVar2;
  bool bVar3;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_50;
  Value *local_48;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_38;
  Value *local_30;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  local_28;
  iterator itr;
  StoreInst *inst_local;
  Impl *impl_local;
  
  itr.
  super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
             )(_Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
               )inst;
  local_30 = LLVMBC::Instruction::getOperand(&inst->super_Instruction,0);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
       ::find(&(impl->ags).coopmat_component_mapping,&local_30);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
       ::end(&(impl->ags).coopmat_component_mapping);
  bVar1 = std::__detail::operator==(&local_28,&local_38);
  bVar3 = true;
  if (!bVar1) {
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                           *)&local_28);
    bVar3 = (ppVar2->second).component == 0;
  }
  if (bVar3) {
    impl_local._7_1_ = false;
  }
  else {
    local_48 = LLVMBC::Instruction::getOperand
                         ((Instruction *)
                          itr.
                          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                          ._M_cur,1);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
         ::find(&(impl->ags).coopmat_component_mapping,&local_48);
    local_28._M_cur = local_40._M_cur;
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AGSCoopMatMapping,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>_>
         ::end(&(impl->ags).coopmat_component_mapping);
    bVar1 = std::__detail::operator==(&local_28,&local_50);
    bVar3 = true;
    if (!bVar1) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false,_false>
                             *)&local_28);
      bVar3 = (ppVar2->second).component == 0;
    }
    if (bVar3) {
      impl_local._7_1_ = false;
    }
    else {
      impl_local._7_1_ = true;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool wmma_store_is_masked(Converter::Impl &impl, const llvm::StoreInst *inst)
{
	auto itr = impl.ags.coopmat_component_mapping.find(inst->getOperand(0));
	if (itr == impl.ags.coopmat_component_mapping.end() || itr->second.component == 0)
		return false;

	itr = impl.ags.coopmat_component_mapping.find(inst->getOperand(1));
	if (itr == impl.ags.coopmat_component_mapping.end() || itr->second.component == 0)
		return false;

	return true;
}